

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.h
# Opt level: O1

void __thiscall Refal2::CQualifier::CQualifier(CQualifier *this)

{
  (this->chars).elements = (char *)0x0;
  (this->labels).elementsSize = 0;
  (this->labels).elements = (int *)0x0;
  (this->numbers).elementsSize = 0;
  (this->numbers).elements = (uint *)0x0;
  (this->ansichars).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->ansichars).super__Base_bitset<2UL>._M_w[1] = 0;
  (this->chars).elementsSize = 0;
  Empty(this);
  return;
}

Assistant:

CQualifier() { Empty(); }